

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

void shkgone(monst *mtmp)

{
  undefined1 *puVar1;
  char cVar2;
  level *lev;
  monst *pmVar3;
  xchar xVar4;
  boolean bVar5;
  mkroom *pmVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  vptrs *pvVar10;
  
  xVar4 = ledger_no((d_level *)&mtmp[0x1b].mxlth);
  lev = levels[xVar4];
  cVar2 = (char)mtmp[0x1b].meating;
  remove_damage(mtmp,'\x01');
  *(undefined8 *)((long)lev->monsters + (long)cVar2 * 0xd8 + 0x3428) = 0;
  pmVar6 = search_special(lev,-2);
  if (pmVar6 == (mkroom *)0x0) {
    puVar1 = &(lev->flags).field_0x8;
    *puVar1 = *puVar1 & 0xfe;
  }
  for (lVar7 = (long)*(char *)((long)lev->monsters + (long)cVar2 * 0xd8 + 0x3358);
      lVar7 <= *(char *)((long)lev->monsters + (long)cVar2 * 0xd8 + 0x3359); lVar7 = lVar7 + 1) {
    for (lVar9 = (long)*(char *)((long)lev->monsters + (long)cVar2 * 0xd8 + 0x335a);
        lVar9 <= *(char *)((long)lev->monsters + (long)cVar2 * 0xd8 + 0x335b); lVar9 = lVar9 + 1) {
      pvVar10 = (vptrs *)(lev->objects[lVar7] + lVar9);
      while (pmVar3 = pvVar10->v_ocarry, pmVar3 != (monst *)0x0) {
        pmVar3->mtrack[3].x = pmVar3->mtrack[3].x & 0xf7;
        pvVar10 = (vptrs *)&pmVar3->data;
      }
    }
  }
  bVar5 = on_level((d_level *)&mtmp[0x1b].mxlth,&mtmp->dlevel->z);
  if (bVar5 != '\0') {
    pcVar8 = strchr(u.ushops,(int)(char)mtmp[0x1b].meating);
    if (pcVar8 != (char *)0x0) {
      setpaid(mtmp);
      mtmp[0x1b].mnum = 0;
      mtmp[0x1b].m_lev = '\0';
      mtmp[0x1b].mx = '\0';
      mtmp[0x1b].my = '\0';
      mtmp[0x1b].mux = '\0';
      mtmp[0x1b].muy = '\0';
      mtmp[0x1b].malign = '\0';
      do {
        cVar2 = pcVar8[1];
        *pcVar8 = cVar2;
        pcVar8 = pcVar8 + 1;
      } while (cVar2 != '\0');
    }
  }
  return;
}

Assistant:

void shkgone(struct monst *mtmp)
{
	struct eshk *eshk = ESHK(mtmp);
	struct level *shoplev = levels[ledger_no(&eshk->shoplevel)];
	struct mkroom *sroom = &shoplev->rooms[eshk->shoproom - ROOMOFFSET];
	struct obj *otmp;
	char *p;
	int sx, sy;

	remove_damage(mtmp, TRUE);
	sroom->resident = NULL;
	if (!search_special(shoplev, ANY_SHOP))
	    shoplev->flags.has_shop = 0;

	/* items on shop floor revert to ordinary objects */
	for (sx = sroom->lx; sx <= sroom->hx; sx++)
	    for (sy = sroom->ly; sy <= sroom->hy; sy++)
	    for (otmp = shoplev->objects[sx][sy]; otmp; otmp = otmp->nexthere)
		otmp->no_charge = 0;

	if (on_level(&eshk->shoplevel, &mtmp->dlevel->z)) {
	    /* Make sure bill is set only when the
	       dead shk is the resident shk. */
	    if ((p = strchr(u.ushops, eshk->shoproom)) != 0) {
		setpaid(mtmp);
		eshk->bill_p = NULL;
		/* remove eshk->shoproom from u.ushops */
		do { *p = *(p + 1); } while (*++p);
	    }
	}
}